

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O3

void decode_fglrx_ioctl_a6(fglrx_ioctl_a6 *d,mmt_memory_dump *args,int argc)

{
  mmt_buf *buf;
  mmt_buf *buf_00;
  bool bVar1;
  
  bVar1 = true;
  if (fglrx_show_unk_zero_fields != 0 || d->unk00 != 0) {
    fprintf(_stdout,"%sunk00: 0x%08x",fglrx_pfx);
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk04 != 0) || (!bVar1)) {
    fprintf(_stdout,"%sunk04: 0x%08x",", ");
  }
  fglrx_pfx = ", ";
  fprintf(_stdout,"%slen1: %d",", ",(ulong)d->len1);
  fglrx_pfx = ", ";
  if (d->_pad0c != 0) {
    fprintf(_stdout,"%s%s_pad0c: 0x%08x%s",", ",colors->err,(ulong)d->_pad0c,colors->reset);
  }
  fglrx_pfx = ", ";
  if (d->ptr1 == 0) {
    buf = (mmt_buf *)0x0;
    fprintf(_stdout,"%sptr1: %s",", ","NULL");
  }
  else {
    fprintf(_stdout,"%sptr1: 0x%016lx",", ");
    if (0 < argc) {
      buf = find_ptr(d->ptr1,args,argc);
      if (buf != (mmt_buf *)0x0) goto LAB_0024cae2;
    }
    fputs(" [no data]",_stdout);
    buf = (mmt_buf *)0x0;
  }
LAB_0024cae2:
  fglrx_pfx = ", ";
  fprintf(_stdout,"%slen2: %d",", ",(ulong)d->len2);
  fglrx_pfx = ", ";
  if (d->_pad1c != 0) {
    fprintf(_stdout,"%s%s_pad1c: 0x%08x%s",", ",colors->err,(ulong)d->_pad1c,colors->reset);
  }
  fglrx_pfx = ", ";
  if (d->ptr2 == 0) {
    buf_00 = (mmt_buf *)0x0;
    fprintf(_stdout,"%sptr2: %s",", ","NULL");
  }
  else {
    fprintf(_stdout,"%sptr2: 0x%016lx",", ");
    if (0 < argc) {
      buf_00 = find_ptr(d->ptr2,args,argc);
      if (buf_00 != (mmt_buf *)0x0) goto LAB_0024cbb2;
    }
    fputs(" [no data]",_stdout);
    buf_00 = (mmt_buf *)0x0;
  }
LAB_0024cbb2:
  fglrx_pfx = ", ";
  bVar1 = true;
  if (fglrx_show_unk_zero_fields != 0 || d->unk28 != 0) {
    fprintf(_stdout,"%sunk28: 0x%08x",", ");
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk2c != 0) || (!bVar1)) {
    fprintf(_stdout,"%sunk2c: 0x%08x",", ");
  }
  fglrx_pfx = ", ";
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (buf != (mmt_buf *)0x0) {
    dump_mmt_buf_as_words_horiz(buf,"ptr1[]:");
  }
  if (buf_00 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_words_horiz(buf_00,"ptr2[]:");
    return;
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_a6(struct fglrx_ioctl_a6 *d, struct mmt_memory_dump *args, int argc)
{
	fglrx_print_x32(d, unk00);
	fglrx_print_x32(d, unk04);
	fglrx_print_d32(d, len1);
	fglrx_print_pad_x32(d, _pad0c);
	struct mmt_buf *data1 = fglrx_print_ptr(d, ptr1, args, argc);
	fglrx_print_d32(d, len2);
	fglrx_print_pad_x32(d, _pad1c);
	struct mmt_buf *data2 = fglrx_print_ptr(d, ptr2, args, argc);
	fglrx_print_x32(d, unk28);
	fglrx_print_x32(d, unk2c);
	mmt_log_cont_nl();

	if (data1)
		dump_mmt_buf_as_words_horiz(data1, "ptr1[]:");
	if (data2)
		dump_mmt_buf_as_words_horiz(data2, "ptr2[]:");
}